

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O1

int __thiscall Node::IsString(Node *this)

{
  int iVar1;
  VariableStruct *pVVar2;
  uint uVar3;
  
  for (; iVar1 = this->Type, iVar1 == 0x2b; this = this->Tree[0]) {
  }
  if ((iVar1 == 0x1d3) || (iVar1 == 0x1cd)) {
    uVar3 = 0;
    pVVar2 = VariableList::Lookup(Variables,&this->TextValue,this->Tree[0],0);
    if (pVVar2 != (VariableStruct *)0x0) {
      uVar3 = (uint)(pVVar2->Type == VARTYPE_DYNSTR || pVVar2->Type == 0x1a0);
    }
  }
  else {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

int Node::IsString(void)
{
	VariableStruct *ThisVar;

	//
	// Try to figure out the variable type
	//
	switch (Type)
	{
	case BAS_V_FUNCTION:
	case BAS_V_NAME:
		//
		// Look for variable in table
		//
		ThisVar = Variables->Lookup(TextValue, Tree[0]);

		//
		// Print this variable
		//
		if (ThisVar != 0)
		{
			switch (ThisVar->Type)
			{
			case BAS_S_STRING:
			case VARTYPE_DYNSTR:
				return 1;

			}
		}
		return 0;

	//
	// Sometomes used for strings.
	//
	case '+':
		return Tree[0]->IsString();

	//
	// I don't know
	//
	default:
		return(0);
	}
}